

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

void __thiscall QTextStream::QTextStream(QTextStream *this,QString *string,OpenMode openMode)

{
  QTextStreamPrivate *pQVar1;
  Int in_EDX;
  QString *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QTextStreamPrivate *unaff_retaddr;
  QTextStreamPrivate *d;
  pointer in_stack_ffffffffffffffa8;
  unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_> *this_00;
  QTextStream *q_ptr;
  
  q_ptr = *(QTextStream **)(in_FS_OFFSET + 0x28);
  *in_RDI = &PTR__QTextStream_00be7f68;
  this_00 = (unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_> *)(in_RDI + 1)
  ;
  operator_new(0x168);
  QTextStreamPrivate::QTextStreamPrivate(unaff_retaddr,q_ptr);
  std::unique_ptr<QTextStreamPrivate,std::default_delete<QTextStreamPrivate>>::
  unique_ptr<std::default_delete<QTextStreamPrivate>,void>(this_00,in_stack_ffffffffffffffa8);
  pQVar1 = d_func((QTextStream *)0x4a765f);
  pQVar1->string = in_RSI;
  (pQVar1->stringOpenMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = in_EDX;
  pQVar1->status = Ok;
  if (*(QTextStream **)(in_FS_OFFSET + 0x28) == q_ptr) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream::QTextStream(QString *string, OpenMode openMode)
    : d_ptr(new QTextStreamPrivate(this))
{
#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStream::QTextStream(QString *string == *%p, openMode = %d)",
           string, int(openMode.toInt()));
#endif
    Q_D(QTextStream);
    d->string = string;
    d->stringOpenMode = openMode;
    d->status = Ok;
}